

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O3

bool __thiscall FPolyObj::MovePolyobj(FPolyObj *this,DVector2 *pos,bool force)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  FBoundingBox bounds;
  byte bVar11;
  bool bVar12;
  undefined3 in_register_00000011;
  FPolyObj *this_00;
  byte bVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined8 local_48;
  double dStack_40;
  DVector2 local_38;
  
  dVar9 = (this->Bounds).m_Box[0];
  dVar10 = (this->Bounds).m_Box[1];
  dVar7 = (this->Bounds).m_Box[2];
  dVar8 = (this->Bounds).m_Box[3];
  UnLinkPolyobj(this);
  DoMovePolyobj(this,pos);
  if ((CONCAT31(in_register_00000011,force) == 0) && ((this->Sidedefs).Count != 0)) {
    uVar14 = 0;
    bVar11 = 0;
    do {
      bVar13 = bVar11;
      bVar12 = CheckMobjBlocking(this,(this->Sidedefs).Array[uVar14]);
      uVar14 = uVar14 + 1;
      bVar11 = bVar13 | bVar12;
    } while (uVar14 < (this->Sidedefs).Count);
    if (bVar13 != 0 || bVar12) {
      local_38.X._0_4_ = *(undefined4 *)&pos->X;
      local_38.Y._0_4_ = *(undefined4 *)&pos->Y;
      local_38.X._4_4_ = *(uint *)((long)&pos->X + 4) ^ 0x80000000;
      local_38.Y._4_4_ = *(uint *)((long)&pos->Y + 4) ^ 0x80000000;
      DoMovePolyobj(this,&local_38);
      LinkPolyobj(this);
      return false;
    }
  }
  dVar3 = pos->Y;
  dVar4 = (this->StartSpot).pos.Y;
  dVar5 = (this->CenterSpot).pos.X;
  dVar6 = (this->CenterSpot).pos.Y;
  (this->StartSpot).pos.X = (this->StartSpot).pos.X + pos->X;
  (this->StartSpot).pos.Y = dVar4 + dVar3;
  dVar3 = pos->Y;
  (this->CenterSpot).pos.X = pos->X + dVar5;
  (this->CenterSpot).pos.Y = dVar3 + dVar6;
  LinkPolyobj(this);
  this_00 = this;
  ClearSubsectorLinks(this);
  dVar3 = (this->Bounds).m_Box[2];
  dVar4 = (this->Bounds).m_Box[3];
  uVar15 = -(ulong)(dVar3 < dVar7);
  uVar16 = -(ulong)(dVar8 < dVar4);
  uVar14 = (ulong)dVar4 & uVar16;
  auVar17._0_8_ = ~uVar15 & (ulong)dVar7;
  auVar17._8_8_ = ~uVar16 & (ulong)dVar8;
  auVar1._8_4_ = (int)uVar14;
  auVar1._0_8_ = (ulong)dVar3 & uVar15;
  auVar1._12_4_ = (int)(uVar14 >> 0x20);
  dVar7 = (this->Bounds).m_Box[0];
  dVar8 = (this->Bounds).m_Box[1];
  uVar15 = -(ulong)(dVar9 < dVar7);
  uVar16 = -(ulong)(dVar8 < dVar10);
  uVar14 = (ulong)dVar8 & uVar16;
  auVar18._0_8_ = ~uVar15 & (ulong)dVar9;
  auVar18._8_8_ = ~uVar16 & (ulong)dVar10;
  auVar2._8_4_ = (int)uVar14;
  auVar2._0_8_ = (ulong)dVar7 & uVar15;
  auVar2._12_4_ = (int)(uVar14 >> 0x20);
  local_48 = SUB168(auVar17 | auVar1,0);
  dStack_40 = SUB168(auVar17 | auVar1,8);
  bounds.m_Box[2] = (double)local_48;
  bounds.m_Box[0] = (double)SUB168(auVar18 | auVar2,0);
  bounds.m_Box[1] = (double)SUB168(auVar18 | auVar2,8);
  bounds.m_Box[3] = dStack_40;
  RecalcActorFloorCeil(this_00,bounds);
  return true;
}

Assistant:

bool FPolyObj::MovePolyobj (const DVector2 &pos, bool force)
{
	FBoundingBox oldbounds = Bounds;
	UnLinkPolyobj ();
	DoMovePolyobj (pos);

	if (!force)
	{
		bool blocked = false;

		for(unsigned i=0;i < Sidedefs.Size(); i++)
		{
			if (CheckMobjBlocking(Sidedefs[i]))
			{
				blocked = true;
			}
		}
		if (blocked)
		{
			DoMovePolyobj (-pos);
			LinkPolyobj();
			return false;
		}
	}
	StartSpot.pos += pos;
	CenterSpot.pos += pos;
	LinkPolyobj ();
	ClearSubsectorLinks();
	RecalcActorFloorCeil(Bounds | oldbounds);
	return true;
}